

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v9::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *__first;
  uint *p;
  buffer<unsigned_int> *in_RSI;
  buffer<unsigned_int> *in_RDI;
  uint *data;
  size_t size;
  size_t in_stack_ffffffffffffffc8;
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  uint *__result;
  
  sVar1 = buffer<unsigned_int>::size(in_RSI);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  __first = buffer<unsigned_int>::data(in_RSI);
  __result = __first + sVar1;
  p = buffer<unsigned_int>::data(in_RDI);
  make_checked<unsigned_int>(p,sVar1);
  std::copy<unsigned_int_const*,unsigned_int*>(__first,(uint *)in_RDI,__result);
  *(undefined4 *)&in_RDI[5].ptr_ = *(undefined4 *)&in_RSI[5].ptr_;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    std::copy(data, data + size, make_checked(bigits_.data(), size));
    exp_ = other.exp_;
  }